

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,TokenNode *tokenNode)

{
  TokenNode *pTVar1;
  VarSymbol *pVVar2;
  FunctionSymbol *pFVar3;
  
  pVVar2 = VarTable::cSearch(varTable,(tokenNode->super_ExpNode).lexeme);
  pFVar3 = FunctionTable::cSearch(functionTable,(tokenNode->super_ExpNode).lexeme);
  if (pVVar2 == (VarSymbol *)0x0) {
    if (pFVar3 != (FunctionSymbol *)0x0) {
      (tokenNode->super_ExpNode).lValue = false;
      pTVar1 = pFVar3->returnType->id;
      (tokenNode->super_ExpNode).type = pTVar1->token;
      (tokenNode->super_ExpNode).typeLexeme = (pTVar1->super_ExpNode).typeLexeme;
      (tokenNode->super_ExpNode).pointer = pFVar3->pointer;
      (tokenNode->super_ExpNode).arraySize = -1;
    }
  }
  else {
    pTVar1 = pVVar2->type->id;
    (tokenNode->super_ExpNode).type = pTVar1->token;
    (tokenNode->super_ExpNode).typeLexeme = (pTVar1->super_ExpNode).typeLexeme;
    (tokenNode->super_ExpNode).arraySize = pVVar2->arraySize;
    (tokenNode->super_ExpNode).pointer = pVVar2->pointer;
    (tokenNode->super_ExpNode).lValue = true;
  }
  return;
}

Assistant:

void SemanticTypes::visit(TokenNode *tokenNode) {
    VarSymbol *var = varTable->cSearch(tokenNode->getLexeme());
    FunctionSymbol *func = functionTable->cSearch(tokenNode->getLexeme());

    if (var) {
        tokenNode->setType(var->getType()->getType());
        tokenNode->setTypeLexeme(var->getType()->getTypeLexeme());
        tokenNode->setArraySize(var->getArraySize());
        tokenNode->setPointer(var->isPointer());
        tokenNode->setLValue(true);
    } else if (func) {

        tokenNode->setLValue(false);
        tokenNode->setType(func->getReturnType()->getType());
        tokenNode->setTypeLexeme(func->getReturnType()->getTypeLexeme());
        tokenNode->setPointer(func->isPointer());
        tokenNode->setArraySize(-1);
    }

}